

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_float_suite::test_same(void)

{
  undefined4 local_38;
  value_type_conflict local_34 [2];
  undefined4 local_2c;
  value_type_conflict local_28 [2];
  undefined4 local_20;
  value_type_conflict local_1c [2];
  undefined1 local_14 [8];
  moment<float> filter;
  
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::basic_moment
            ((basic_moment<float,_(trial::online::with)1> *)local_14,0.125);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_14,1.0);
  local_1c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_14);
  local_20 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xed,"void mean_float_suite::test_same()",local_1c,&local_20);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_14,1.0);
  local_28[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_14);
  local_2c = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xef,"void mean_float_suite::test_same()",local_28,&local_2c);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_14,1.0);
  local_34[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_14);
  local_38 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xf1,"void mean_float_suite::test_same()",local_34,&local_38);
  return;
}

Assistant:

void test_same()
{
    decay::moment<float> filter(one_over_eight);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
}